

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin-cursor.c
# Opt level: O3

int coda_bin_cursor_read_uint8_partial_array
              (coda_cursor *cursor,long offset,long length,uint8_t *dst)

{
  int iVar1;
  coda_type *pcVar2;
  ulong uVar3;
  coda_cursor array_cursor;
  coda_cursor local_340;
  
  pcVar2 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar2->format) {
    pcVar2 = *(coda_type **)&pcVar2->type_class;
  }
  if ((*(coda_type **)(pcVar2 + 1))->format != coda_format_ascii) {
    if ((*(coda_type **)(pcVar2 + 1))->format != coda_format_binary) {
      __assert_fail("type->base_type->format == coda_format_ascii",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-bin-cursor.c"
                    ,0x4b6,
                    "int coda_bin_cursor_read_uint8_partial_array(const coda_cursor *, long, long, uint8_t *)"
                   );
    }
    iVar1 = read_partial_array(cursor,coda_bin_cursor_read_uint8,offset,length,dst,1);
    return iVar1;
  }
  memcpy(&local_340,cursor,0x310);
  if (0 < length) {
    iVar1 = coda_cursor_goto_array_element_by_index(&local_340,offset);
    if (iVar1 != 0) {
      return -1;
    }
    uVar3 = 0;
    do {
      iVar1 = coda_ascii_cursor_read_uint8(&local_340,dst + uVar3);
      if (iVar1 != 0) {
        return -1;
      }
      if ((uVar3 < length - 1U) &&
         (iVar1 = coda_cursor_goto_next_array_element(&local_340), iVar1 != 0)) {
        return -1;
      }
      uVar3 = uVar3 + 1;
    } while (length != uVar3);
  }
  return 0;
}

Assistant:

int coda_bin_cursor_read_uint8_partial_array(const coda_cursor *cursor, long offset, long length, uint8_t *dst)
{
    coda_type_array *type = (coda_type_array *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    if (type->base_type->format == coda_format_binary)
    {
        return read_partial_array(cursor, (read_function)&coda_bin_cursor_read_uint8, offset, length, (uint8_t *)dst,
                                  sizeof(uint8_t));
    }
    assert(type->base_type->format == coda_format_ascii);
    return read_partial_array(cursor, (read_function)&coda_ascii_cursor_read_uint8, offset, length, (uint8_t *)dst,
                              sizeof(uint8_t));
}